

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O3

int lest::select(int __nfds,fd_set *__readfds,fd_set *__writefds,fd_set *__exceptfds,
                timeval *__timeout)

{
  bool bVar1;
  int iVar2;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  uint uVar3;
  text *line;
  undefined4 in_register_0000003c;
  long *plVar4;
  _Alloc_hider _Var5;
  long *plVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_128;
  size_type local_120;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118;
  text local_108;
  text local_e8;
  text local_c8;
  text local_a8;
  text local_88;
  text local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  plVar4 = (long *)CONCAT44(in_register_0000003c,__nfds);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_48,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)__readfds);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  if (local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    paVar7 = &local_68.field_2;
    local_68._M_dataplus._M_p = (pointer)paVar7;
    std::__cxx11::string::_M_construct<char*>((string *)&local_68,*plVar4,plVar4[1] + *plVar4);
    bVar1 = hidden(&local_68);
    uVar3 = (uint)CONCAT71(extraout_var,bVar1);
    _Var5._M_p = local_68._M_dataplus._M_p;
LAB_0010f86c:
    uVar3 = uVar3 ^ 1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var5._M_p != paVar7) {
      operator_delete(_Var5._M_p);
    }
  }
  else if (__readfds->fds_bits[1] == __readfds->fds_bits[0]) {
LAB_0010f8bb:
    uVar3 = 0;
  }
  else {
    plVar6 = (long *)(__readfds->fds_bits[1] + -0x20);
    iVar2 = std::__cxx11::string::compare((char *)plVar6);
    line = (text *)CONCAT71((int7)((ulong)&local_48 >> 8),1);
    uVar3 = (uint)line;
    if (iVar2 != 0) {
      do {
        iVar2 = std::__cxx11::string::compare((char *)plVar6);
        if (iVar2 == 0) break;
        local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
        std::__cxx11::string::_M_construct<char*>((string *)&local_a8,*plVar6,plVar6[1] + *plVar6);
        local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
        line = &local_c8;
        std::__cxx11::string::_M_construct<char*>((string *)line,*plVar4,plVar4[1] + *plVar4);
        bVar1 = search(&local_a8,line);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
          operator_delete(local_c8._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
          operator_delete(local_a8._M_dataplus._M_p);
        }
        if (bVar1) break;
        if (*(char *)*plVar6 == '!') {
          std::__cxx11::string::substr((ulong)&local_128,(ulong)plVar6);
          local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
          if (local_128 == &local_118) {
            local_108.field_2._8_4_ = local_118._8_4_;
            local_108.field_2._12_4_ = local_118._12_4_;
          }
          else {
            local_108._M_dataplus._M_p = (pointer)local_128;
          }
          local_108.field_2._M_allocated_capacity._4_4_ = local_118._M_allocated_capacity._4_4_;
          local_108.field_2._M_allocated_capacity._0_4_ = local_118._M_allocated_capacity._0_4_;
          line = &local_e8;
          local_108._M_string_length = local_120;
          local_120 = 0;
          local_118._M_allocated_capacity._0_4_ = local_118._M_allocated_capacity._0_4_ & 0xffffff00
          ;
          local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
          local_128 = &local_118;
          std::__cxx11::string::_M_construct<char*>((string *)line,*plVar4,plVar4[1] + *plVar4);
          bVar1 = search(&local_108,line);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
            operator_delete(local_e8._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_108._M_dataplus._M_p != &local_108.field_2) {
            operator_delete(local_108._M_dataplus._M_p);
          }
          if (local_128 != &local_118) {
            operator_delete(local_128);
          }
          if (bVar1) goto LAB_0010f8bb;
          if (plVar6 == (long *)__readfds->fds_bits[0]) {
            paVar7 = &local_88.field_2;
            local_88._M_dataplus._M_p = (pointer)paVar7;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_88,*plVar4,plVar4[1] + *plVar4);
            bVar1 = hidden(&local_88);
            uVar3 = (uint)CONCAT71(extraout_var_00,bVar1);
            _Var5._M_p = local_88._M_dataplus._M_p;
            goto LAB_0010f86c;
          }
        }
        else if (plVar6 == (long *)__readfds->fds_bits[0]) goto LAB_0010f8bb;
        plVar6 = plVar6 + -4;
        iVar2 = std::__cxx11::string::compare((char *)plVar6);
      } while (iVar2 != 0);
      uVar3 = (uint)CONCAT71((int7)((ulong)line >> 8),1);
    }
  }
  return uVar3;
}

Assistant:

inline bool select( text name, texts include )
{
    if ( none( include ) )
    {
        return ! hidden( name );
    }

    bool any = false;
    for ( texts::reverse_iterator pos = include.rbegin(); pos != include.rend(); ++pos )
    {
        text & part = *pos;

        if ( part == "@" || part == "*" )
            return true;

        if ( search( part, name ) )
            return true;

        if ( '!' == part[0] )
        {
            any = true;
            if ( search( part.substr(1), name ) )
                return false;
        }
        else
        {
            any = false;
        }
    }
    return any && ! hidden( name );
}